

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O3

uint32_t crc32c::Extend(uint32_t crc,uint8_t *data,size_t count)

{
  long lVar1;
  uint32_t uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (Extend(unsigned_int,unsigned_char_const*,unsigned_long)::can_use_sse42 == '\0') {
    Extend();
  }
  if (Extend::can_use_sse42 == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      uVar2 = ExtendSse42(crc,data,count);
      return uVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar2 = ExtendPortable(crc,data,count);
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t Extend(uint32_t crc, const uint8_t* data, size_t count) {
#if HAVE_SSE42 && (defined(_M_X64) || defined(__x86_64__))
  static bool can_use_sse42 = CanUseSse42();
  if (can_use_sse42) return ExtendSse42(crc, data, count);
#elif HAVE_ARM64_CRC32C
  static bool can_use_arm64_crc32 = CanUseArm64Crc32();
  if (can_use_arm64_crc32) return ExtendArm64(crc, data, count);
#endif  // HAVE_SSE42 && (defined(_M_X64) || defined(__x86_64__))

  return ExtendPortable(crc, data, count);
}